

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O2

void compute_response_layer_unconditional_strided(response_layer *layer,integral_image *iimage)

{
  uint uVar1;
  int iVar2;
  bool *pbVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int rows;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int row;
  int col;
  int ii;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  int local_108;
  float *local_f0;
  float top_left;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  pbVar3 = layer->laplacian;
  pfVar23 = layer->response;
  iVar14 = layer->filter_size;
  uVar1 = layer->height;
  iVar2 = layer->step;
  uVar6 = layer->width;
  lVar19 = (long)(int)uVar6;
  rows = iVar14 / 3;
  iVar20 = (iVar14 + -1) / 2;
  fVar26 = 1.0 / (float)(iVar14 * iVar14);
  uVar6 = ~((int)uVar6 >> 0x1f) & uVar6;
  lVar15 = 0;
  iVar10 = rows * 2 + -1;
  for (uVar7 = 0; uVar7 != (~((int)uVar1 >> 0x1f) & uVar1); uVar7 = uVar7 + 1) {
    iVar8 = uVar7 * iVar2;
    lVar15 = (long)(int)lVar15;
    row = (iVar8 - rows) + 1;
    iVar21 = 1 - rows;
    iVar16 = -(iVar14 / 6);
    col = -iVar20;
    uVar9 = uVar6;
    while (bVar25 = uVar9 != 0, uVar9 = uVar9 - 1, bVar25) {
      fVar27 = box_integral_unconditional(iimage,row,col,iVar10,iVar14);
      auVar31._0_4_ = box_integral_unconditional(iimage,row,iVar16,iVar10,rows);
      auVar31._4_60_ = extraout_var;
      auVar5 = vfmadd213ss_fma(auVar31._0_16_,SUB6416(ZEXT464(0xc0400000),0),ZEXT416((uint)fVar27));
      fVar27 = box_integral_unconditional(iimage,iVar8 - iVar20,iVar21,iVar14,iVar10);
      auVar32._0_4_ = box_integral_unconditional(iimage,iVar8 - iVar14 / 6,iVar21,rows,iVar10);
      auVar32._4_60_ = extraout_var_00;
      auVar4 = vfmadd132ss_fma(auVar32._0_16_,ZEXT416((uint)fVar27),ZEXT416(0xc0400000));
      fVar27 = fVar26 * auVar5._0_4_;
      fVar28 = fVar26 * auVar4._0_4_;
      pfVar23[lVar15] = fVar27 * fVar28;
      pbVar3[lVar15] = 0.0 <= fVar27 + fVar28;
      lVar15 = lVar15 + 1;
      col = col + iVar2;
      iVar16 = iVar16 + iVar2;
      iVar21 = iVar21 + iVar2;
    }
  }
  uVar7 = (rows + 1) / iVar2;
  lVar15 = (long)(int)uVar7;
  iVar14 = 1;
  uVar13 = 0;
  while( true ) {
    uVar18 = uVar13;
    local_108 = iVar14;
    local_f0 = pfVar23;
    if (uVar13 == (~((int)uVar7 >> 0x1f) & uVar7)) break;
    while ((long)uVar18 <= (long)(int)(uVar1 + uVar7 * -0xc)) {
      uVar11 = (long)(int)(uVar7 * 0xc) + uVar18;
      iVar10 = (int)uVar18 * iVar2 - rows;
      pfVar22 = local_f0;
      for (uVar12 = 0; uVar12 != uVar6; uVar12 = uVar12 + 1) {
        iVar16 = (int)uVar12 * iVar2;
        iVar21 = iVar16 - rows;
        fVar27 = box_integral_unconditional(iimage,iVar10,iVar21,rows,rows);
        iVar16 = iVar16 + 1;
        fVar28 = box_integral_unconditional(iimage,iVar10,iVar16,rows,rows);
        uVar17 = uVar18;
        pfVar24 = pfVar22;
        iVar20 = local_108;
        while ((long)uVar17 < (long)uVar11) {
          fVar29 = box_integral_unconditional(iimage,iVar20,iVar21,rows,rows);
          fVar30 = box_integral_unconditional(iimage,iVar20,iVar16,rows,rows);
          uVar17 = uVar17 + lVar15;
          iVar20 = iVar20 + iVar2 * uVar7;
          fVar27 = (((fVar29 + fVar28) - fVar27) - fVar30) * fVar26;
          auVar4 = vfmadd213ss_fma(ZEXT416((uint)(fVar27 * -0.81)),ZEXT416((uint)fVar27),
                                   ZEXT416((uint)*pfVar24));
          *pfVar24 = auVar4._0_4_;
          pfVar24 = pfVar24 + lVar19 * lVar15;
          fVar28 = fVar30;
          fVar27 = fVar29;
        }
        pfVar22 = pfVar22 + 1;
      }
      local_108 = local_108 + iVar2 * uVar7 * 0xc;
      local_f0 = local_f0 + lVar19 * (int)(uVar7 * 0xc);
      uVar18 = uVar11;
    }
    for (; (long)uVar18 < (long)(int)uVar1; uVar18 = uVar18 + lVar15) {
      iVar16 = (int)uVar18 * iVar2;
      iVar21 = iVar16 - rows;
      iVar16 = iVar16 + 1;
      iVar10 = 1;
      iVar20 = -rows;
      for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
        fVar27 = box_integral_unconditional(iimage,iVar21,iVar10,rows,rows);
        fVar28 = box_integral_unconditional(iimage,iVar16,iVar20,rows,rows);
        fVar29 = box_integral_unconditional(iimage,iVar21,iVar20,rows,rows);
        fVar30 = box_integral_unconditional(iimage,iVar16,iVar10,rows,rows);
        fVar27 = (((fVar28 + fVar27) - fVar29) - fVar30) * fVar26;
        auVar4 = vfmadd213ss_fma(ZEXT416((uint)(fVar27 * -0.81)),ZEXT416((uint)fVar27),
                                 ZEXT416((uint)local_f0[uVar11]));
        local_f0[uVar11] = auVar4._0_4_;
        iVar20 = iVar20 + iVar2;
        iVar10 = iVar10 + iVar2;
      }
      local_f0 = local_f0 + lVar19 * lVar15;
    }
    iVar14 = iVar14 + iVar2;
    pfVar23 = pfVar23 + lVar19;
    uVar13 = uVar13 + 1;
  }
  return;
}

Assistant:

void compute_response_layer_unconditional_strided(struct response_layer *layer, struct integral_image *iimage) {
    /*
    base function: compute_response_layer_unconditional

    optimizations:
        - Computes Dxy in a strided manner (reusing parts), as a result eliminates unnecessary
            recomputations
    */

    float *response = layer->response;
    bool *laplacian = layer->laplacian;

    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size/3;
    int border = (filter_size-1)/2;
    float inv_area = 1.f/(filter_size*filter_size);

    int Dxy_stride = (lobe+1)/step;
    // printf("\nDxy_stride: lobe+1:%d step:%d Dxy_stride:%d\n", lobe+1, step, Dxy_stride);

    // int Dxx_col_stride = lobe/step;
    // printf("Dyy_row_stride/Dxx_col_stride: lobe:%d step:%d Dxx_col_stride:%d\n", lobe, step, Dxx_col_stride);

    int Dxx_col_stride = (2*lobe)/step;
    // printf("2*Dyy_row_stride/2*Dxx_col_stride: lobe:%d step:%d 2*Dxx_col_stride:%d\n", lobe, step, Dxx_col_stride);

    // int Dxx_row_stride = (2*lobe - 1)/step;
    // printf("Dyy_col_stride/Dxx_row_stride: 2*lobe-1:%d step:%d Dxx_row_stride:%d\n", 2*lobe-1, step, Dxx_row_stride);

    // int Dyy_col_stride = (2*lobe - 1)/step;
    int Dyy_row_stride = (2*lobe)/step;

    for (int i = 0, ind = 0; i < height; ++i) {
        int x = i*step;
        for (int j = 0; j < width; ++j, ind++) {
            // Image coordinates
            int y = j*step;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            float Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            float Dyy = box_integral_unconditional(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral_unconditional(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy;
            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0);
        }
    }
    /*
    {
        int i_unroll = 24;
    // printf("\n");
    // printf("Dyy_row_stride %d step %d \n", Dyy_row_stride, step);
    // for (int i_offset=0; i_offset<Dyy_row_stride-i_unroll+1; i_offset+=i_unroll) {
        int i_offset=0;
        for (; i_offset<Dyy_row_stride; i_offset+=1) {
            // printf("j_offset: %d - %d ", j_offset, j_offset+j_unroll-1);
            int i = i_offset;
            for (; i < height-(Dyy_row_stride*i_unroll)+1; i+=Dyy_row_stride*i_unroll) {

                for (int j = 0; j < width; j++) {
                    int y = j*step;
                    int x = i*step;
                    for (int ii = i; ii<i+(Dyy_row_stride*i_unroll); ii+=Dyy_row_stride) {
                        // Image coordinates
                        int x = ii*step;

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        float Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        float Dyy = box_integral_unconditional(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                                - 3 * box_integral_unconditional(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dyy *= inv_area;

                        // Calculate Determinant
                        response[ii*width + j] = Dxx * Dyy;
                        // Calculate Laplacian
                        laplacian[ii*width + j] = (Dxx + Dyy >= 0);
                    }
                }
            }

            for (; i < height; i+=Dxy_stride) {
                int x = i*step;
                for (int j = 0; j < width; j++) {
                    // Image coordinates
                    int y = j*step;

                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    float Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                            - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                    float Dyy = box_integral_unconditional(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                            - 3 * box_integral_unconditional(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);

                    // Normalize Responses with inverse area
                    Dxx *= inv_area;
                    Dyy *= inv_area;

                    // Calculate Determinant
                    response[i*width + j] = Dxx * Dyy;
                    // Calculate Laplacian
                    laplacian[i*width + j] = (Dxx + Dyy >= 0);

                }

            }
        }
    }
    */



    // strided Dxy
    {
        int i_unroll = 12;
    // printf("\n");
    // printf("Dxy_stride %d step %d \n", Dxy_stride, step);
    // for (int i_offset=0; i_offset<Dxy_stride-i_unroll+1; i_offset+=i_unroll) {
        int i_offset=0;
        /**/
        for (; i_offset<Dxy_stride; i_offset+=1) {
            // printf("j_offset: %d - %d ", j_offset, j_offset+j_unroll-1);
            int i = i_offset;
            for (; i < height-(Dxy_stride*i_unroll)+1; i+=Dxy_stride*i_unroll) {

                for (int j = 0; j < width; j++) {
                    int y = j*step;
                    int x = i*step;
                    float bottom_left = box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe);
                    float bottom_right = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe);
                    for (int ii = i; ii<i+(Dxy_stride*i_unroll); ii+=Dxy_stride) {
                        // Image coordinates
                        int x = ii*step;

                        float top_left = bottom_left;//box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe);
                        float top_right = bottom_right;//box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe);

                        bottom_left = box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe);
                        bottom_right = box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);


                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        float Dxy = top_right //box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + bottom_left //box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - top_left //box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - bottom_right; //box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // printf("i:%d j:%d ii:%d jj:%d New Filter: %d %d | %d %d | %d %d | %d %d\n", i, j, ii, jj, x - lobe, y + 1, x + 1, y - lobe, x - lobe, y - lobe, x + 1, y + 1);


                        // Normalize Responses with inverse area
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ii*width + j] -= 0.81f * Dxy * Dxy;
                        // printf("ii:%d ",ii);
                    }
                }
            }
            // printf("i:%d \n",i);

            for (; i < height; i+=Dxy_stride) {
                int x = i*step;
                for (int j = 0; j < width; j++) {
                    // Image coordinates
                    int y = j*step;

                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    float Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                            + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                            - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                            - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                    // printf("i:%d j:%d ii:%d jj:%d New Filter: %d %d | %d %d | %d %d | %d %d\n", i, j, ii, jj, x - lobe, y + 1, x + 1, y - lobe, x - lobe, y - lobe, x + 1, y + 1);


                    // Normalize Responses with inverse area
                    Dxy *= inv_area;

                    // Calculate Determinant
                    response[i*width + j] -= 0.81f * Dxy * Dxy;

                }

            }
        }
    }
        /**/
        /*
        for (; i_offset<Dxy_stride; i_offset+=1) {
            // printf("j_offset: %d ", j_offset);
            for (int i = i_offset; i < height; i+=Dxy_stride) {
                int x = i*step;
                for (int j = 0; j < width; j+=1) {
                    // Image coordinates
                    int y = j*step;

                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    float Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                            + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                            - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                            - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                    // printf("i:%d j:%d ii:%d jj:%d New Filter: %d %d | %d %d | %d %d | %d %d\n", i, j, ii, jj, x - lobe, y + 1, x + 1, y - lobe, x - lobe, y - lobe, x + 1, y + 1);


                    // Normalize Responses with inverse area
                    Dxy *= inv_area;

                    // Calculate Determinant
                    response[i*width + j] -= 0.81f * Dxy * Dxy;

                }

            }
        }
        */
    // }
}